

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  undefined4 in_EAX;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  size_type loc;
  size_t length;
  char __c;
  size_type __pos;
  undefined7 in_register_00000031;
  size_type sVar6;
  string *__str;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44((int)CONCAT71(in_register_00000031,detect),in_EAX);
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000",(allocator<char> *)((long)&uStack_38 + 3));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999",(allocator<char> *)((long)&uStack_38 + 2));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  __c = (char)((ulong)_uStack_38 >> 0x20);
  __str = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (__c == '0') {
    __str = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str,0);
  do {
    if (sVar4 == 0xffffffffffffffff) {
      return;
    }
    __pos = sVar4 + 5;
    sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,__c,__pos);
    if (sVar5 == 0xffffffffffffffff) {
      if ((char)local_34 != '9') {
        __pos = unit_string->_M_string_length;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(unit_string,'.',sVar4);
        if (sVar5 != 0xffffffffffffffff) {
          loc = sVar4 - 1;
          pcVar2 = (unit_string->_M_dataplus)._M_p;
          sVar6 = loc;
          if (sVar5 == loc) {
            do {
              do {
                sVar4 = sVar6;
                sVar6 = 0;
              } while (sVar4 == 0);
              cVar1 = pcVar2[sVar4 - 1];
              if (9 < (byte)(cVar1 - 0x30U)) goto LAB_0035390b;
              sVar6 = sVar4 - 1;
            } while (cVar1 == '0');
LAB_003538bc:
            length = ~loc;
            goto LAB_003538fa;
          }
          do {
            sVar5 = sVar5 + 1;
            loc = sVar4;
            if (sVar4 <= sVar5) goto LAB_003538bc;
          } while ((byte)(pcVar2[sVar5] - 0x30U) < 10);
        }
      }
    }
    else {
      __pos = sVar5 + 1;
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar2[sVar5];
      if (((cVar1 != '.') &&
          (((9 < (byte)(cVar1 - 0x30U) ||
            ((__pos < unit_string->_M_string_length &&
             (sVar5 = __pos, 9 < (byte)(pcVar2[__pos] - 0x30U))))) &&
           (loc = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(unit_string,'.',sVar4), loc != 0xffffffffffffffff)))) &&
         (length = sVar5 - loc, 0xc < length)) {
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        sVar6 = loc;
        if (loc == sVar4 - 1) {
          do {
            if ((sVar6 == 0) || (cVar1 = pcVar2[sVar6 - 1], 9 < (byte)(cVar1 - 0x30U)))
            goto LAB_0035390b;
            sVar6 = sVar6 - 1;
          } while (cVar1 == '0');
LAB_003538fa:
          shorten_number(unit_string,loc,length);
          __pos = loc + 1;
        }
        else {
          do {
            loc = loc + 1;
            if (sVar4 <= loc) {
              length = sVar5 - sVar4;
              loc = sVar4;
              goto LAB_003538fa;
            }
          } while ((byte)(pcVar2[loc] - 0x30U) < 10);
        }
      }
    }
LAB_0035390b:
    sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str,__pos);
  } while( true );
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}